

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

void __thiscall RTQuaternion::normalize(RTQuaternion *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  
  auVar2 = *(undefined1 (*) [16])this->m_data;
  fVar3 = SQRT(auVar2._12_4_ * auVar2._12_4_ +
               auVar2._8_4_ * auVar2._8_4_ +
               auVar2._0_4_ * auVar2._0_4_ + auVar2._4_4_ * auVar2._4_4_);
  if (((fVar3 != 0.0) || (NAN(fVar3))) && ((fVar3 != 1.0 || (NAN(fVar3))))) {
    auVar1._4_4_ = fVar3;
    auVar1._0_4_ = fVar3;
    auVar1._8_4_ = fVar3;
    auVar1._12_4_ = fVar3;
    auVar2 = divps(auVar2,auVar1);
    *(undefined1 (*) [16])this->m_data = auVar2;
  }
  return;
}

Assistant:

void RTQuaternion::normalize()
{
    RTFLOAT length = sqrt(m_data[0] * m_data[0] + m_data[1] * m_data[1] +
            m_data[2] * m_data[2] + m_data[3] * m_data[3]);

    if ((length == 0) || (length == 1))
        return;

    m_data[0] /= length;
    m_data[1] /= length;
    m_data[2] /= length;
    m_data[3] /= length;
}